

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

bool __thiscall QWizardPage::isFinalPage(QWizardPage *this)

{
  int iVar1;
  QWizardPage *pQVar2;
  long lVar3;
  QWizardPagePrivate *d;
  QWizardPage *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QWizardPage *local_28;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QWidget).field_0x8;
  bVar5 = true;
  if (*(char *)(lVar3 + 0x30c) != '\0') goto LAB_0050a6c7;
  pQVar4 = *(QWizardPage **)(lVar3 + 600);
  if (pQVar4 == (QWizardPage *)0x0) {
LAB_0050a6a9:
    lVar3 = 0x1c0;
    pQVar4 = this;
  }
  else {
    lVar3 = *(long *)&(pQVar4->super_QWidget).field_0x8;
    local_1c = *(int *)(lVar3 + 0x340);
    local_28 = (QWizardPage *)0x0;
    pQVar2 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar3 + 0x2e0),&local_1c,&local_28);
    if (pQVar2 != this) goto LAB_0050a6a9;
    lVar3 = 0x1d0;
  }
  iVar1 = (**(code **)(*(long *)&pQVar4->super_QWidget + lVar3))(pQVar4);
  bVar5 = iVar1 == -1;
LAB_0050a6c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizardPage::isFinalPage() const
{
    Q_D(const QWizardPage);
    if (d->explicitlyFinal)
        return true;

    QWizard *wizard = this->wizard();
    if (wizard && wizard->currentPage() == this) {
        // try to use the QWizard implementation if possible
        return wizard->nextId() == -1;
    } else {
        return nextId() == -1;
    }
}